

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayEqualFailureOnExceptionIncludesCheckContents::
~TestCheckArrayEqualFailureOnExceptionIncludesCheckContents
          (TestCheckArrayEqualFailureOnExceptionIncludesCheckContents *this)

{
  TestCheckArrayEqualFailureOnExceptionIncludesCheckContents *this_local;
  
  ~TestCheckArrayEqualFailureOnExceptionIncludesCheckContents(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArrayEqualFailureOnExceptionIncludesCheckContents)
{
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		const float data[4] = { 0, 1, 2, 3 };
        ThrowingObject obj;
        CHECK_ARRAY_EQUAL (data, obj, 3);
    }

    CHECK(strstr(reporter.lastFailedMessage, "data"));
    CHECK(strstr(reporter.lastFailedMessage, "obj"));
}